

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void bindSuperClass(VM *vm,Class *subClass,Class *superClass)

{
  undefined4 uVar1;
  uint uVar2;
  Method *pMVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  
  subClass->superClass = superClass;
  subClass->fieldNum = subClass->fieldNum + superClass->fieldNum;
  if ((superClass->methods).count != 0) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      pMVar3 = (superClass->methods).datas;
      uVar1 = *(undefined4 *)((long)pMVar3 + lVar6 + -8);
      uVar4 = *(undefined8 *)((long)&pMVar3->type + lVar6);
      uVar2 = (subClass->methods).count;
      if (uVar2 <= uVar5) {
        MethodBufferFillWrite(vm,&subClass->methods,(Method)ZEXT816(0),((int)uVar5 - uVar2) + 1);
      }
      pMVar3 = (subClass->methods).datas;
      *(undefined4 *)((long)pMVar3 + lVar6 + -8) = uVar1;
      *(undefined8 *)((long)&pMVar3->type + lVar6) = uVar4;
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (superClass->methods).count);
  }
  return;
}

Assistant:

void bindSuperClass(VM *vm, Class *subClass, Class *superClass) {
    subClass->superClass = superClass;
    subClass->fieldNum += superClass->fieldNum;
    uint32_t idx = 0;
    while (idx < superClass->methods.count) {
        bindMethod(vm, subClass, idx, superClass->methods.datas[idx]);
        idx++;
    }
}